

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O2

Color __thiscall PlasticBSDF::f(PlasticBSDF *this,vec3f *wo,vec3f *wi,HitInfo *hit)

{
  vec3f *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Color CVar13;
  vec3f local_80;
  vec3f local_70;
  Color local_60;
  vec3f local_50;
  vec3f local_40;
  
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_50.z = 0.0;
  pvVar1 = &(hit->super_Hit).Ns;
  BSDF::getLocalBasis(pvVar1,&local_40,&local_50);
  fVar6 = local_40.z;
  fVar2 = local_50.z;
  fVar8 = wo->x;
  fVar9 = wo->y;
  fVar10 = wo->z;
  fVar4 = local_40.x;
  fVar5 = local_40.y;
  fVar11 = local_50.x;
  fVar12 = local_50.y;
  local_70.z = dot(wo,pvVar1);
  fVar7 = local_40.z;
  fVar3 = local_50.z;
  local_70.y = fVar10 * fVar2 + fVar8 * fVar11 + fVar9 * fVar12;
  local_70.x = fVar10 * fVar6 + fVar8 * fVar4 + fVar9 * fVar5;
  fVar8 = wi->x;
  fVar9 = wi->y;
  fVar10 = wi->z;
  fVar2 = local_40.x;
  fVar4 = local_40.y;
  fVar11 = local_50.x;
  fVar12 = local_50.y;
  local_80.z = dot(wi,pvVar1);
  local_80.y = fVar10 * fVar3 + fVar8 * fVar11 + fVar9 * fVar12;
  local_80.x = fVar10 * fVar7 + fVar8 * fVar2 + fVar9 * fVar4;
  pvVar1 = &(hit->super_Hit).Ng;
  fVar8 = dot(wo,pvVar1);
  fVar9 = dot(wi,pvVar1);
  fVar12 = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  if (0.0 < fVar9 == 0.0 < fVar8) {
    CVar13 = BSDF::albedo(&this->super_BSDF,&(hit->super_Hit).uv);
    local_60.z = CVar13.z;
    local_60._0_8_ = CVar13._0_8_;
    CVar13 = f(this,&local_60,&local_70,&local_80);
    fVar12 = CVar13.z;
    fVar10 = CVar13.x;
    fVar11 = CVar13.y;
  }
  CVar13.y = fVar11;
  CVar13.x = fVar10;
  CVar13.z = fVar12;
  return CVar13;
}

Assistant:

Color f(const vec3f& wo, const vec3f& wi, const HitInfo& hit) const
	{
		vec3f N1,N2;
		getLocalBasis(hit.Ns, N1, N2);
		// transform wo, wi to local surface Ns' = (0,0,1)
		vec3f woL = vec3f(dot(wo,N1), dot(wo,N2), dot(wo,hit.Ns));
		vec3f wiL = vec3f(dot(wi,N1), dot(wi,N2), dot(wi,hit.Ns));
		// use Ng to determine whether BRDF or BTDF is used
		bool through = (dot(wo, hit.Ng)>0) ^ (dot(wi, hit.Ng)>0);
		BxDF::Type allowed = through? BxDF::TRANSMIT : BxDF::REFLECT;
		return (BxDF::REFLECT & allowed)? f(albedo(hit.uv), woL, wiL): 0;
	}